

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall mocker::ir::Assign::~Assign(Assign *this)

{
  Assign *this_local;
  
  ~Assign(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Assign(std::shared_ptr<Reg> dest, std::shared_ptr<Addr> operand)
      : IRInst(InstType::Assign), Definition(std::move(dest)),
        operand(std::move(operand)) {}